

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_list::erase_peer(peer_list *this,torrent_peer *p,torrent_state *state)

{
  bool bVar1;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_130;
  torrent_peer **local_110;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_108;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_e8;
  undefined1 local_c8 [8];
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  iter;
  iterator local_a0;
  iterator local_80;
  undefined1 local_60 [8];
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  torrent_state *state_local;
  torrent_peer *p_local;
  peer_list *this_local;
  
  range.second._M_node = (_Map_pointer)state;
  state_local = (torrent_state *)p;
  p_local = (torrent_peer *)this;
  ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  begin(&local_80,
        (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *)
        this);
  ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  end(&local_a0,
      (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *)
      this);
  ::std::
  equal_range<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,libtorrent::aux::torrent_peer*,libtorrent::aux::peer_address_compare>
            (local_60,&local_80,&local_a0,&state_local);
  ::std::
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  ::_Deque_iterator(&local_e8,
                    (_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                     *)local_60);
  ::std::
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  ::_Deque_iterator(&local_108,
                    (_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                     *)&range.first._M_node);
  local_110 = (torrent_peer **)&state_local;
  ::std::
  find_if<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::__0>
            ((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
              *)local_c8,&local_e8,&local_108,(anon_class_8_1_54a39810_for__M_pred)local_110);
  bVar1 = ::std::operator==((_Self *)local_c8,(_Self *)&range.first._M_node);
  if (!bVar1) {
    ::std::
    _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
    ::_Deque_iterator(&local_130,
                      (_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                       *)local_c8);
    erase_peer(this,&local_130,(torrent_state *)range.second._M_node);
  }
  return;
}

Assistant:

void peer_list::erase_peer(torrent_peer* p, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		TORRENT_ASSERT(p->in_use);
		TORRENT_ASSERT(m_locked_peer != p);

		auto const range = std::equal_range(m_peers.begin(), m_peers.end(), p, peer_address_compare{});
		auto const iter = std::find_if(range.first, range.second, [&](torrent_peer const* needle) {
			return torrent_peer_equal(needle, p);
		});
		if (iter == range.second) return;
		erase_peer(iter, state);
	}